

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_escape(flatcc_json_printer_t *ctx,uchar c)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  uchar x;
  uchar c_local;
  flatcc_json_printer_t *ctx_local;
  
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\\';
  if (c == '\b') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 'b';
  }
  else if (c == '\t') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 't';
  }
  else if (c == '\n') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 'n';
  }
  else if (c == '\f') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 'f';
  }
  else if (c == '\r') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 'r';
  }
  else if (c == '\"') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\"';
  }
  else if (c == '\\') {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\\';
  }
  else {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = 'u';
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '0';
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '0';
    bVar2 = (byte)((int)(uint)c >> 4);
    cVar3 = 'W';
    if (bVar2 < 10) {
      cVar3 = '0';
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = bVar2 + cVar3;
    cVar3 = 'W';
    if ((c & 0xf) < 10) {
      cVar3 = '0';
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = (c & 0xf) + cVar3;
  }
  return;
}

Assistant:

static void print_escape(flatcc_json_printer_t *ctx, unsigned char c)
{
    unsigned char x;

    print_char('\\');
    switch (c) {
    case '"': print_char('\"'); break;
    case '\\': print_char('\\'); break;
    case '\t' : print_char('t'); break;
    case '\f' : print_char('f'); break;
    case '\r' : print_char('r'); break;
    case '\n' : print_char('n'); break;
    case '\b' : print_char('b'); break;
    default:
        print_char('u');
        print_char('0');
        print_char('0');
        x = c >> 4;
        x += x < 10 ? '0' : 'a' - 10;
        print_char((char)x);
        x = c & 15;
        x += x < 10 ? '0' : 'a' - 10;
        print_char((char)x);
        break;
    }
}